

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::default_unit(string *unit_type)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  pointer pvVar6;
  ulong uVar7;
  precise_unit pVar8;
  unit_data local_3c4;
  string local_3c0;
  undefined1 local_3a0 [8];
  precise_unit retunit;
  precise_unit local_370;
  allocator local_359;
  string local_358;
  string local_338;
  string local_318;
  allocator local_2f1;
  string local_2f0;
  string local_2d0;
  allocator local_2a9;
  string local_2a8;
  string local_288;
  allocator local_261;
  string local_260;
  string local_240;
  allocator local_219;
  string local_218;
  allocator local_1f1;
  string local_1f0;
  allocator local_1c9;
  string local_1c8;
  string local_1a8;
  undefined1 local_188 [8];
  precise_unit tunit;
  string local_158;
  long local_138;
  size_type fof;
  precise_unit local_110;
  string local_100;
  string local_e0;
  string local_c0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
  local_a0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
  local_98;
  const_iterator fnd;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  undefined8 local_80;
  char local_71;
  char *local_70;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  undefined8 local_58;
  char *local_50;
  char *local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  string *local_20;
  string *unit_type_local;
  undefined8 local_10;
  
  local_20 = unit_type;
  if ((default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_)
     , iVar3 != 0)) {
    loadDefinedMeasurementTypes_abi_cxx11_();
    __cxa_atexit(std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
                 ::~unordered_map,&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_);
  }
  lVar4 = std::__cxx11::string::size();
  if (lVar4 == 1) {
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)unit_type);
    cVar1 = *pcVar5;
    if (cVar1 == -0x38) {
      local_10._0_4_ = (unit_data)0x10000;
      local_10._4_4_ = 0;
      unit_type_local = (string *)0x3ff0000000000000;
      return _unit_type_local;
    }
    if (cVar1 == 'I') {
      local_10._0_4_ = (unit_data)0x800;
      local_10._4_4_ = 0;
      unit_type_local = (string *)0x3ff0000000000000;
      return _unit_type_local;
    }
    if (cVar1 == 'J') {
      local_10._0_4_ = (unit_data)0x4000;
      local_10._4_4_ = 0;
      unit_type_local = (string *)0x3ff0000000000000;
      return _unit_type_local;
    }
    if (cVar1 == 'L') {
      local_10._0_4_ = (unit_data)0x1;
      local_10._4_4_ = 0;
      unit_type_local = (string *)0x3ff0000000000000;
      return _unit_type_local;
    }
    if (cVar1 == 'M') {
      local_10._0_4_ = (unit_data)0x100;
      local_10._4_4_ = 0;
      unit_type_local = (string *)0x3ff0000000000000;
      return _unit_type_local;
    }
    if (cVar1 == 'N') {
      local_10._0_4_ = (unit_data)0x80000;
      local_10._4_4_ = 0;
      unit_type_local = (string *)0x3ff0000000000000;
      return _unit_type_local;
    }
    if (cVar1 == 'T') {
      local_10._0_4_ = (unit_data)0x10;
      local_10._4_4_ = 0;
      unit_type_local = (string *)0x3ff0000000000000;
      return _unit_type_local;
    }
    if (cVar1 == 'l') {
      _unit_type_local = (precise_unit)ZEXT816(0x3ff0000000000000);
      return _unit_type_local;
    }
  }
  local_38._M_current = (char *)std::__cxx11::string::begin();
  local_40._M_current = (char *)std::__cxx11::string::end();
  local_48 = (char *)std::__cxx11::string::begin();
  local_50 = (char *)std::
                     transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                               (local_38,local_40,
                                (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_48,tolower);
  local_68._M_current = (char *)std::__cxx11::string::begin();
  local_70 = (char *)std::__cxx11::string::end();
  local_71 = ' ';
  local_60 = std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                       (local_68,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )local_70,&local_71);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_58,&local_60);
  local_88._M_current = (char *)std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_80,&local_88);
  fnd.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
             )std::__cxx11::string::erase(unit_type,local_58,local_80);
  local_98._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
       ::find(&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_,unit_type);
  local_a0._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
       ::end(&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_);
  bVar2 = std::__detail::operator!=(&local_98,&local_a0);
  if (bVar2) {
    pvVar6 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_false,_true>
                           *)&local_98);
    _unit_type_local = pvVar6->second;
  }
  else {
    pcVar5 = (char *)std::__cxx11::string::front();
    if (((*pcVar5 == '[') && (pcVar5 = (char *)std::__cxx11::string::back(), *pcVar5 == ']')) ||
       ((pcVar5 = (char *)std::__cxx11::string::front(), *pcVar5 == '{' &&
        (pcVar5 = (char *)std::__cxx11::string::back(), *pcVar5 == '}')))) {
      std::__cxx11::string::pop_back();
      std::__cxx11::string::substr((ulong)&local_c0,(ulong)unit_type);
      _unit_type_local = default_unit(&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    else {
      iVar3 = std::__cxx11::string::compare((ulong)unit_type,0,(char *)0xa);
      if (iVar3 == 0) {
        std::__cxx11::string::substr((ulong)&local_e0,(ulong)unit_type);
        _unit_type_local = default_unit(&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
      }
      else {
        iVar3 = std::__cxx11::string::compare((ulong)unit_type,0,(char *)0x9);
        if (iVar3 == 0) {
          std::__cxx11::string::substr((ulong)&local_100,(ulong)unit_type);
          _unit_type_local = default_unit(&local_100);
          std::__cxx11::string::~string((string *)&local_100);
        }
        else {
          iVar3 = std::__cxx11::string::compare((ulong)unit_type,0,(char *)0x6);
          if (iVar3 == 0) {
            std::__cxx11::string::substr((ulong)&fof,(ulong)unit_type);
            local_110 = default_unit((string *)&fof);
            _unit_type_local = precise_unit::operator/(&local_110,(precise_unit *)precise::s);
            std::__cxx11::string::~string((string *)&fof);
          }
          else {
            local_138 = std::__cxx11::string::rfind((char *)unit_type,0x1d9383);
            if (local_138 == -1) {
              local_138 = std::__cxx11::string::find_first_of((char *)unit_type,0x1d938d);
              if (local_138 == -1) {
                iVar3 = std::__cxx11::string::compare((ulong)unit_type,0,(char *)0x3);
                if (iVar3 == 0) {
                  std::__cxx11::string::substr((ulong)&local_1a8,(ulong)unit_type);
                  pVar8 = default_unit(&local_1a8);
                  tunit.multiplier_ = pVar8._8_8_;
                  local_188 = (undefined1  [8])pVar8.multiplier_;
                  std::__cxx11::string::~string((string *)&local_1a8);
                  bVar2 = is_error((precise_unit *)local_188);
                  if (!bVar2) {
                    pVar8 = precise_unit::inv((precise_unit *)local_188);
                    return pVar8;
                  }
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_1c8,"rto",&local_1c9);
                bVar2 = ends_with(unit_type,&local_1c8);
                std::__cxx11::string::~string((string *)&local_1c8);
                std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
                if (bVar2) {
                  _unit_type_local = (precise_unit)ZEXT816(0x3ff0000000000000);
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_1f0,"fr",&local_1f1);
                  bVar2 = ends_with(unit_type,&local_1f0);
                  std::__cxx11::string::~string((string *)&local_1f0);
                  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
                  if (bVar2) {
                    _unit_type_local = (precise_unit)ZEXT816(0x3ff0000000000000);
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)&local_218,"quantity",&local_219);
                    bVar2 = ends_with(unit_type,&local_218);
                    std::__cxx11::string::~string((string *)&local_218);
                    std::allocator<char>::~allocator((allocator<char> *)&local_219);
                    if (bVar2) {
                      std::__cxx11::string::size();
                      std::__cxx11::string::substr((ulong)&local_240,(ulong)unit_type);
                      _unit_type_local = default_unit(&local_240);
                      std::__cxx11::string::~string((string *)&local_240);
                    }
                    else {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string((string *)&local_260,"quantities",&local_261);
                      bVar2 = ends_with(unit_type,&local_260);
                      std::__cxx11::string::~string((string *)&local_260);
                      std::allocator<char>::~allocator((allocator<char> *)&local_261);
                      if (bVar2) {
                        std::__cxx11::string::size();
                        std::__cxx11::string::substr((ulong)&local_288,(ulong)unit_type);
                        _unit_type_local = default_unit(&local_288);
                        std::__cxx11::string::~string((string *)&local_288);
                      }
                      else {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string((string *)&local_2a8,"measure",&local_2a9);
                        bVar2 = ends_with(unit_type,&local_2a8);
                        std::__cxx11::string::~string((string *)&local_2a8);
                        std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
                        if (bVar2) {
                          std::__cxx11::string::size();
                          std::__cxx11::string::substr((ulong)&local_2d0,(ulong)unit_type);
                          _unit_type_local = default_unit(&local_2d0);
                          std::__cxx11::string::~string((string *)&local_2d0);
                        }
                        else {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string((string *)&local_2f0,"size",&local_2f1);
                          bVar2 = ends_with(unit_type,&local_2f0);
                          std::__cxx11::string::~string((string *)&local_2f0);
                          std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
                          if (bVar2) {
                            std::__cxx11::string::size();
                            std::__cxx11::string::substr((ulong)&local_318,(ulong)unit_type);
                            _unit_type_local = default_unit(&local_318);
                            std::__cxx11::string::~string((string *)&local_318);
                          }
                          else {
                            pcVar5 = (char *)std::__cxx11::string::back();
                            if ((*pcVar5 == 's') &&
                               (uVar7 = std::__cxx11::string::size(), 1 < uVar7)) {
                              std::__cxx11::string::pop_back();
                              std::__cxx11::string::string((string *)&local_338,(string *)unit_type)
                              ;
                              _unit_type_local = default_unit(&local_338);
                              std::__cxx11::string::~string((string *)&local_338);
                            }
                            else {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string((string *)&local_358,"rate",&local_359);
                              bVar2 = ends_with(unit_type,&local_358);
                              std::__cxx11::string::~string((string *)&local_358);
                              std::allocator<char>::~allocator((allocator<char> *)&local_359);
                              if (bVar2) {
                                std::__cxx11::string::size();
                                std::__cxx11::string::substr
                                          ((ulong)&retunit.base_units_,(ulong)unit_type);
                                local_370 = default_unit((string *)&retunit.base_units_);
                                _unit_type_local =
                                     precise_unit::operator/(&local_370,(precise_unit *)precise::s);
                                std::__cxx11::string::~string((string *)&retunit.base_units_);
                              }
                              else {
                                std::__cxx11::string::string
                                          ((string *)&local_3c0,(string *)unit_type);
                                pVar8 = unit_from_string(&local_3c0,0x8000000);
                                retunit.multiplier_ = pVar8._8_8_;
                                local_3a0 = (undefined1  [8])pVar8.multiplier_;
                                std::__cxx11::string::~string((string *)&local_3c0);
                                bVar2 = is_valid((precise_unit *)local_3a0);
                                if (bVar2) {
                                  local_3c4 = precise_unit::base_units((precise_unit *)local_3a0);
                                  precise_unit::precise_unit
                                            ((precise_unit *)&unit_type_local,&local_3c4);
                                }
                                else {
                                  local_10._0_4_ = (unit_data)0xfa94a488;
                                  local_10._4_4_ = 0;
                                  unit_type_local = (string *)0x7ff4000000000000;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              else {
                std::__cxx11::string::substr((ulong)&tunit.base_units_,(ulong)unit_type);
                _unit_type_local = default_unit((string *)&tunit.base_units_);
                std::__cxx11::string::~string((string *)&tunit.base_units_);
              }
            }
            else {
              std::__cxx11::string::substr((ulong)&local_158,(ulong)unit_type);
              _unit_type_local = default_unit(&local_158);
              std::__cxx11::string::~string((string *)&local_158);
            }
          }
        }
      }
    }
  }
  return _unit_type_local;
}

Assistant:

precise_unit default_unit(std::string unit_type)
{
    static const smap measurement_types = loadDefinedMeasurementTypes();

    if (unit_type.size() == 1) {
        switch (unit_type[0]) {
            case 'L':
                return precise::m;
            case 'M':
                return precise::kg;
            case 'T':
                return precise::second;
            case '\xC8':
                return precise::Kelvin;
            case 'I':
                return precise::A;
            case 'N':
                return precise::mol;
            case 'J':
                return precise::cd;
            case 'l':
                return precise::one;
        }
    }
    std::transform(
        unit_type.begin(), unit_type.end(), unit_type.begin(), ::tolower);
    unit_type.erase(
        std::remove(unit_type.begin(), unit_type.end(), ' '), unit_type.end());
    auto fnd = measurement_types.find(unit_type);
    if (fnd != measurement_types.end()) {
        return fnd->second;
    }
    if ((unit_type.front() == '[' && unit_type.back() == ']') ||
        (unit_type.front() == '{' && unit_type.back() == '}')) {
        unit_type.pop_back();
        return default_unit(unit_type.substr(1));
    }
    if (unit_type.compare(0, 10, "quantityof") == 0) {
        return default_unit(unit_type.substr(10));
    }
    if (unit_type.compare(0, 9, "measureof") == 0) {
        return default_unit(unit_type.substr(9));
    }
    if (unit_type.compare(0, 6, "rateof") == 0) {
        return default_unit(unit_type.substr(6)) / precise::s;
    }
    auto fof = unit_type.rfind("of");
    if (fof != std::string::npos) {
        return default_unit(unit_type.substr(0, fof));
    }
    fof = unit_type.find_first_of("([{");
    if (fof != std::string::npos) {
        return default_unit(unit_type.substr(0, fof));
    }
    if (unit_type.compare(0, 3, "inv") == 0) {
        auto tunit = default_unit(unit_type.substr(3));
        if (!is_error(tunit)) {
            return tunit.inv();
        }
    }
    if (ends_with(unit_type, "rto")) {
        // ratio of some kind
        return precise::one;
    }
    if (ends_with(unit_type, "fr")) {
        // ratio of some kind
        return precise::one;
    }
    if (ends_with(unit_type, "quantity")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("quantity")));
    }
    if (ends_with(unit_type, "quantities")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("quantities")));
    }
    if (ends_with(unit_type, "measure")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("measure")));
    }
    if (ends_with(unit_type, "size")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("size")));
    }
    if (unit_type.back() == 's' && unit_type.size() > 1) {
        unit_type.pop_back();
        return default_unit(unit_type);
    }
    if (ends_with(unit_type, "rate")) {
        return default_unit(
                   unit_type.substr(0, unit_type.size() - strlen("rate"))) /
            precise::s;
    }
    auto retunit = unit_from_string(unit_type, no_default_units);
    if (is_valid(retunit)) {
        return precise_unit(retunit.base_units());
    }
    return precise::invalid;
}